

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O3

void __thiscall
Assimp::DXFImporter::InternReadFile
          (DXFImporter *this,string *filename,aiScene *pScene,IOSystem *pIOHandler)

{
  aiNode *paVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  _Alloc_hider __s2;
  int iVar18;
  undefined4 extraout_var;
  Logger *pLVar19;
  long *plVar20;
  runtime_error *prVar21;
  long *plVar22;
  FileData *extraout_RDX;
  char *pcVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  shared_ptr<Assimp::IOStream> file;
  FileData output;
  LineReader reader;
  char buff [25];
  StreamReaderLE stream;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c8;
  aiScene *local_2c0;
  shared_ptr<Assimp::IOStream> local_2b8;
  FileData local_2a8;
  long *local_290;
  long local_280 [2];
  LineReader local_270;
  char local_208 [40];
  StreamReader<false,_false> local_1e0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  ios_base local_138 [264];
  IOStream *__p;
  
  local_2c0 = pScene;
  local_1a8 = &local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"rb","");
  iVar18 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(filename->_M_dataplus)._M_p,local_1a8);
  __p = (IOStream *)CONCAT44(extraout_var,iVar18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::IOStream*>(&local_2c8,__p)
  ;
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,local_198 + 1);
  }
  if (__p == (IOStream *)0x0) {
    prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_270,
                   "Failed to open DXF file ",filename);
    plVar20 = (long *)std::__cxx11::string::append((char *)&local_270);
    local_1a8 = (long *)*plVar20;
    plVar22 = plVar20 + 2;
    if (local_1a8 == plVar22) {
      local_198 = *plVar22;
      lStack_190 = plVar20[3];
      local_1a8 = &local_198;
    }
    else {
      local_198 = *plVar22;
    }
    local_1a0 = plVar20[1];
    *plVar20 = (long)plVar22;
    plVar20[1] = 0;
    *(undefined1 *)(plVar20 + 2) = 0;
    std::runtime_error::runtime_error(prVar21,(string *)&local_1a8);
    *(undefined ***)prVar21 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar21,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_208[0x10] = 0;
  local_208[0x11] = '\0';
  local_208[0x12] = '\0';
  local_208[0x13] = '\0';
  local_208[0x14] = '\0';
  local_208[0x15] = '\0';
  local_208[0x16] = '\0';
  local_208[0x17] = '\0';
  local_208[0x18] = '\0';
  local_208[0] = '\0';
  local_208[1] = '\0';
  local_208[2] = '\0';
  local_208[3] = '\0';
  local_208[4] = '\0';
  local_208[5] = '\0';
  local_208[6] = '\0';
  local_208[7] = '\0';
  local_208[8] = 0;
  local_208[9] = '\0';
  local_208[10] = '\0';
  local_208[0xb] = '\0';
  local_208[0xc] = '\0';
  local_208[0xd] = '\0';
  local_208[0xe] = '\0';
  local_208[0xf] = '\0';
  (*__p->_vptr_IOStream[2])(__p,local_208,0x18,1);
  iVar18 = strncmp(AI_DXF_BINARY_IDENT_abi_cxx11_._M_dataplus._M_p,local_208,0x18);
  if (iVar18 == 0) {
    prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1a8 = &local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1a8,"DXF: Binary files are not supported at the moment","");
    std::runtime_error::runtime_error(prVar21,(string *)&local_1a8);
    *(undefined ***)prVar21 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar21,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  (*__p->_vptr_IOStream[4])(__p,0,0);
  local_2b8.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_2c8._M_pi;
  if (local_2c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2c8._M_pi)->_M_use_count = (local_2c8._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2c8._M_pi)->_M_use_count = (local_2c8._M_pi)->_M_use_count + 1;
    }
  }
  local_2b8.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __p;
  StreamReader<false,_false>::StreamReader(&local_1e0,&local_2b8,false);
  if (local_2b8.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b8.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  DXF::LineReader::LineReader(&local_270,&local_1e0);
  local_2a8.blocks.super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.blocks.super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8.blocks.super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_270.end < 2) {
    do {
      __s2._M_p = local_270.value._M_dataplus._M_p;
      if (local_270.groupcode == 0) {
        iVar18 = strcmp("EOF",local_270.value._M_dataplus._M_p);
        if (iVar18 == 0) goto LAB_00435319;
LAB_00435581:
        DXF::LineReader::operator++(&local_270);
      }
      else {
        if (local_270.groupcode == 999) {
          pLVar19 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[14]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_1a8,(char (*) [14])"DXF Comment: ");
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,local_270.value._M_dataplus._M_p,
                     local_270.value._M_string_length);
          std::__cxx11::stringbuf::str();
          Logger::info(pLVar19,(char *)local_290);
          if (local_290 != local_280) {
            operator_delete(local_290,local_280[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          std::ios_base::~ios_base(local_138);
          goto LAB_00435581;
        }
        if (local_270.groupcode != 2) goto LAB_00435581;
        iVar18 = strcmp("BLOCKS",local_270.value._M_dataplus._M_p);
        if (iVar18 == 0) {
          ParseBlocks(this,&local_270,&local_2a8);
        }
        else {
          iVar18 = strcmp("ENTITIES",__s2._M_p);
          if (iVar18 == 0) {
            ParseEntities(this,&local_270,&local_2a8);
          }
          else {
            pcVar23 = "CLASSES";
            iVar18 = strcmp("CLASSES",__s2._M_p);
            if (iVar18 != 0) {
              pcVar23 = "TABLES";
              iVar18 = strcmp("TABLES",__s2._M_p);
              if (iVar18 != 0) {
                pcVar23 = "HEADER";
                iVar18 = strcmp("HEADER",__s2._M_p);
                if (iVar18 != 0) goto LAB_00435581;
                ParseHeader((DXFImporter *)pcVar23,&local_270,extraout_RDX);
                goto LAB_00435589;
              }
            }
            SkipSection((DXFImporter *)pcVar23,&local_270);
          }
        }
      }
LAB_00435589:
    } while (local_270.end < 2);
  }
  pLVar19 = DefaultLogger::get();
  Logger::warn(pLVar19,"DXF: EOF reached, but did not encounter DXF EOF marker");
LAB_00435319:
  ConvertMeshes(this,local_2c0,&local_2a8);
  paVar1 = local_2c0->mRootNode;
  fVar2 = (paVar1->mTransformation).a1;
  fVar3 = (paVar1->mTransformation).a2;
  fVar4 = (paVar1->mTransformation).a3;
  fVar5 = (paVar1->mTransformation).a4;
  fVar6 = (paVar1->mTransformation).b1;
  fVar7 = (paVar1->mTransformation).b2;
  fVar8 = (paVar1->mTransformation).b3;
  fVar9 = (paVar1->mTransformation).b4;
  fVar10 = (paVar1->mTransformation).c1;
  fVar11 = (paVar1->mTransformation).c2;
  fVar12 = (paVar1->mTransformation).c3;
  fVar13 = (paVar1->mTransformation).c4;
  fVar14 = (paVar1->mTransformation).d1;
  fVar15 = (paVar1->mTransformation).d2;
  fVar16 = (paVar1->mTransformation).d3;
  fVar17 = (paVar1->mTransformation).d4;
  fVar28 = fVar2 * 0.0;
  fVar29 = fVar3 * 0.0;
  fVar30 = fVar4 * 0.0;
  fVar31 = fVar5 * 0.0;
  fVar36 = fVar6 * 0.0;
  fVar37 = fVar7 * 0.0;
  fVar38 = fVar8 * 0.0;
  fVar39 = fVar9 * 0.0;
  fVar32 = fVar28 + fVar36;
  fVar33 = fVar29 + fVar37;
  fVar34 = fVar30 + fVar38;
  fVar35 = fVar31 + fVar39;
  fVar40 = fVar10 * 0.0;
  fVar41 = fVar11 * 0.0;
  fVar42 = fVar12 * 0.0;
  fVar43 = fVar13 * 0.0;
  fVar24 = fVar14 * 0.0;
  fVar25 = fVar15 * 0.0;
  fVar26 = fVar16 * 0.0;
  fVar27 = fVar17 * 0.0;
  (paVar1->mTransformation).a1 = fVar36 + fVar2 + fVar40 + fVar24;
  (paVar1->mTransformation).a2 = fVar37 + fVar3 + fVar41 + fVar25;
  (paVar1->mTransformation).a3 = fVar38 + fVar4 + fVar42 + fVar26;
  (paVar1->mTransformation).a4 = fVar39 + fVar5 + fVar43 + fVar27;
  (paVar1->mTransformation).b1 = fVar32 + fVar10 + fVar24;
  (paVar1->mTransformation).b2 = fVar33 + fVar11 + fVar25;
  (paVar1->mTransformation).b3 = fVar34 + fVar12 + fVar26;
  (paVar1->mTransformation).b4 = fVar35 + fVar13 + fVar27;
  (paVar1->mTransformation).c1 = (fVar28 - fVar6) + fVar40 + fVar24;
  (paVar1->mTransformation).c2 = (fVar29 - fVar7) + fVar41 + fVar25;
  (paVar1->mTransformation).c3 = (fVar30 - fVar8) + fVar42 + fVar26;
  (paVar1->mTransformation).c4 = (fVar31 - fVar9) + fVar43 + fVar27;
  (paVar1->mTransformation).d1 = fVar40 + fVar32 + fVar14;
  (paVar1->mTransformation).d2 = fVar41 + fVar33 + fVar15;
  (paVar1->mTransformation).d3 = fVar42 + fVar34 + fVar16;
  (paVar1->mTransformation).d4 = fVar43 + fVar35 + fVar17;
  std::vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>::~vector(&local_2a8.blocks);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.value._M_dataplus._M_p != &local_270.value.field_2) {
    operator_delete(local_270.value._M_dataplus._M_p,
                    local_270.value.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.splitter.mCur._M_dataplus._M_p != &local_270.splitter.mCur.field_2) {
    operator_delete(local_270.splitter.mCur._M_dataplus._M_p,
                    local_270.splitter.mCur.field_2._M_allocated_capacity + 1);
  }
  StreamReader<false,_false>::~StreamReader(&local_1e0);
  if (local_2c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8._M_pi);
  }
  return;
}

Assistant:

void DXFImporter::InternReadFile( const std::string& filename, aiScene* pScene, IOSystem* pIOHandler) {
    std::shared_ptr<IOStream> file = std::shared_ptr<IOStream>( pIOHandler->Open( filename) );

    // Check whether we can read the file
    if( file.get() == nullptr ) {
        throw DeadlyImportError( "Failed to open DXF file " + filename + "");
    }

    // Check whether this is a binary DXF file - we can't read binary DXF files :-(
    char buff[AI_DXF_BINARY_IDENT_LEN+1] = {0};
    file->Read(buff,AI_DXF_BINARY_IDENT_LEN,1);

    if (0 == strncmp(AI_DXF_BINARY_IDENT.c_str(),buff,AI_DXF_BINARY_IDENT_LEN)) {
        throw DeadlyImportError("DXF: Binary files are not supported at the moment");
    }

    // DXF files can grow very large, so read them via the StreamReader,
    // which will choose a suitable strategy.
    file->Seek(0,aiOrigin_SET);
    StreamReaderLE stream( file );

    DXF::LineReader reader (stream);
    DXF::FileData output;

    // now get all lines of the file and process top-level sections
    bool eof = false;
    while(!reader.End()) {

        // blocks table - these 'build blocks' are later (in ENTITIES)
        // referenced an included via INSERT statements.
        if (reader.Is(2,"BLOCKS")) {
            ParseBlocks(reader,output);
            continue;
        }

        // primary entity table
        if (reader.Is(2,"ENTITIES")) {
            ParseEntities(reader,output);
            continue;
        }

        // skip unneeded sections entirely to avoid any problems with them
        // altogether.
        else if (reader.Is(2,"CLASSES") || reader.Is(2,"TABLES")) {
            SkipSection(reader);
            continue;
        }

        else if (reader.Is(2,"HEADER")) {
            ParseHeader(reader,output);
            continue;
        }

        // comments
        else if (reader.Is(999)) {
            ASSIMP_LOG_INFO_F("DXF Comment: ", reader.Value());
        }

        // don't read past the official EOF sign
        else if (reader.Is(0,"EOF")) {
            eof = true;
            break;
        }

        ++reader;
    }
    if (!eof) {
        ASSIMP_LOG_WARN("DXF: EOF reached, but did not encounter DXF EOF marker");
    }

    ConvertMeshes(pScene,output);

    // Now rotate the whole scene by 90 degrees around the x axis to convert from AutoCAD's to Assimp's coordinate system
    pScene->mRootNode->mTransformation = aiMatrix4x4(
        1.f,0.f,0.f,0.f,
        0.f,0.f,1.f,0.f,
        0.f,-1.f,0.f,0.f,
        0.f,0.f,0.f,1.f) * pScene->mRootNode->mTransformation;
}